

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O2

size_t __thiscall io_buf::buf_read(io_buf *this,char **pointer,size_t n)

{
  char *pcVar1;
  char *__src;
  char *__dest;
  int *piVar2;
  ssize_t sVar3;
  ulong uVar4;
  size_t __n;
  
  do {
    pcVar1 = (this->space)._end;
    __src = this->head;
    if (__src + n <= pcVar1) {
      *pointer = __src;
      this->head = this->head + n;
      return n;
    }
    __dest = (this->space)._begin;
    if (__src != __dest) {
      __n = (long)pcVar1 - (long)__src;
      memmove(__dest,__src,__n);
      pcVar1 = (this->space)._begin;
      this->head = pcVar1;
      (this->space)._end = pcVar1 + __n;
    }
    sVar3 = fill(this,(this->files)._begin[this->current]);
  } while ((0 < sVar3) ||
          (piVar2 = (this->files)._end, uVar4 = this->current + 1, this->current = uVar4,
          uVar4 < (ulong)((long)piVar2 - (long)(this->files)._begin >> 2)));
  *pointer = this->head;
  pcVar1 = (this->space)._end;
  this->head = pcVar1;
  return (long)pcVar1 - (long)*pointer;
}

Assistant:

size_t io_buf::buf_read(char*& pointer, size_t n)
{
  // return a pointer to the next n bytes.  n must be smaller than the maximum size.
  if (head + n <= space.end())
  {
    pointer = head;
    head += n;
    return n;
  }
  else  // out of bytes, so refill.
  {
    if (head != space.begin())  // There exists room to shift.
    {
      // Out of buffer so swap to beginning.
      size_t left = space.end() - head;
      memmove(space.begin(), head, left);
      head = space.begin();
      space.end() = space.begin() + left;
    }
    if (fill(files[current]) > 0)   // read more bytes from current file if present
      return buf_read(pointer, n);  // more bytes are read.
    else if (++current < files.size())
      return buf_read(pointer, n);  // No more bytes, so go to next file and try again.
    else
    {
      // no more bytes to read, return all that we have left.
      pointer = head;
      head = space.end();
      return space.end() - pointer;
    }
  }
}